

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

bool __thiscall
DebugMallocImplementation::GetNumericProperty
          (DebugMallocImplementation *this,char *name,size_t *value)

{
  bool bVar1;
  int iVar2;
  TestingPortal *pTVar3;
  size_t qsize;
  bool result;
  anon_class_1_0_00000001 local_31;
  TestingPortal **local_30;
  TestingPortal **portal;
  size_t *value_local;
  char *name_local;
  DebugMallocImplementation *this_local;
  
  portal = (TestingPortal **)value;
  value_local = (size_t *)name;
  name_local = (char *)this;
  local_30 = tcmalloc::TestingPortal::CheckGetPortal(name,value);
  if (local_30 == (TestingPortal **)0x0) {
    bVar1 = TCMallocImplementation::GetNumericProperty
                      (&this->super_TCMallocImplementation,(char *)value_local,(size_t *)portal);
    this_local._7_1_ = bVar1;
    if (((bVar1) &&
        (iVar2 = strcmp((char *)value_local,"generic.current_allocated_bytes"), iVar2 == 0)) &&
       (pTVar3 = (TestingPortal *)MallocBlock::FreeQueueSize(), pTVar3 <= *portal)) {
      *portal = (TestingPortal *)((long)*portal - (long)pTVar3);
    }
  }
  else {
    if ((GetNumericProperty(char_const*,unsigned_long*)::ptr == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetNumericProperty(char_const*,unsigned_long*)::ptr),
       iVar2 != 0)) {
      GetNumericProperty::ptr = GetNumericProperty::anon_class_1_0_00000001::operator()(&local_31);
      __cxa_guard_release(&GetNumericProperty(char_const*,unsigned_long*)::ptr);
    }
    *local_30 = (TestingPortal *)GetNumericProperty::ptr;
    *portal = (TestingPortal *)0x1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      static DebugTestingPortal* ptr = ([] () {
        static tcmalloc::StaticStorage<DebugTestingPortal> storage;
        return storage.Construct();
      })();
      *portal = ptr;
      *value = 1;
      return true;
    }

    bool result = TCMallocImplementation::GetNumericProperty(name, value);
    if (result && (strcmp(name, "generic.current_allocated_bytes") == 0)) {
      // Subtract bytes kept in the free queue
      size_t qsize = MallocBlock::FreeQueueSize();
      if (*value >= qsize) {
        *value -= qsize;
      }
    }
    return result;
  }